

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::CompressedCubeFormatCase::init
          (CompressedCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  TextureCube *pTVar1;
  
  pTVar1 = glu::TextureCube::create
                     (this->m_renderCtx,this->m_renderCtxInfo,
                      ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                      (int)((ulong)((long)(this->m_filenames).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_filenames).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) / 6,
                      &this->m_filenames);
  this->m_texture = pTVar1;
  this->m_curFace = 0;
  this->m_isOk = true;
  return (int)pTVar1;
}

Assistant:

void CompressedCubeFormatCase::init (void)
{
	// Create texture.
	DE_ASSERT(m_filenames.size() % 6 == 0);
	m_texture = TextureCube::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size()/6, m_filenames);

	m_curFace	= 0;
	m_isOk		= true;
}